

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_pyr_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  REF_INT node;
  REF_INT cell;
  REF_INT local_38 [6];
  
  local_38[0] = 0;
  local_38[1] = 1;
  local_38[2] = 2;
  local_38[3] = 3;
  local_38[4] = 4;
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    uVar4 = ref_node_add(ref_node,0,&node);
    if (uVar4 == 0) {
      pRVar2 = ref_node->real;
      pRVar3 = pRVar2 + (long)node * 0xf;
      *pRVar3 = 0.0;
      pRVar3[1] = 0.0;
      pRVar2[(long)node * 0xf + 2] = 0.0;
      uVar4 = ref_node_add(ref_node,1,&node);
      if (uVar4 == 0) {
        pRVar3 = ref_node->real;
        pRVar3[(long)node * 0xf] = 1.0;
        pRVar3 = pRVar3 + (long)node * 0xf + 1;
        *pRVar3 = 0.0;
        pRVar3[1] = 0.0;
        uVar4 = ref_node_add(ref_node,2,&node);
        if (uVar4 == 0) {
          pRVar2 = ref_node->real;
          pRVar3 = pRVar2 + (long)node * 0xf;
          *(undefined4 *)pRVar3 = 0;
          *(undefined4 *)((long)pRVar3 + 4) = 0;
          *(undefined4 *)(pRVar3 + 1) = 0;
          *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
          pRVar2[(long)node * 0xf + 2] = 0.0;
          uVar4 = ref_node_add(ref_node,3,&node);
          if (uVar4 == 0) {
            pRVar2 = ref_node->real;
            pRVar3 = pRVar2 + (long)node * 0xf;
            *pRVar3 = 0.0;
            pRVar3[1] = 0.0;
            pRVar2[(long)node * 0xf + 2] = 1.0;
            uVar4 = ref_node_add(ref_node,4,&node);
            if (uVar4 == 0) {
              pRVar2 = ref_node->real;
              pRVar3 = pRVar2 + (long)node * 0xf;
              *pRVar3 = 1.0;
              pRVar3[1] = 0.0;
              pRVar2[(long)node * 0xf + 2] = 1.0;
              uVar4 = ref_node_initialize_n_global(ref_node,5);
              if (uVar4 == 0) {
                uVar4 = ref_cell_add(pRVar1->cell[9],local_38,&cell);
                if (uVar4 == 0) {
                  local_38[0] = 0;
                  local_38[1] = 3;
                  local_38[2] = 4;
                  local_38[3] = 1;
                  local_38[4] = 10;
                  uVar4 = ref_cell_add(pRVar1->cell[6],local_38,&cell);
                  if (uVar4 == 0) {
                    local_38[0] = 0;
                    local_38[1] = 1;
                    local_38[2] = 2;
                    local_38[3] = 0x14;
                    uVar4 = ref_cell_add(pRVar1->cell[3],local_38,&cell);
                    if (uVar4 == 0) {
                      local_38[0] = 1;
                      local_38[1] = 4;
                      local_38[2] = 2;
                      local_38[3] = 0x14;
                      uVar4 = ref_cell_add(pRVar1->cell[3],local_38,&cell);
                      if (uVar4 == 0) {
                        local_38[0] = 4;
                        local_38[1] = 3;
                        local_38[2] = 2;
                        local_38[3] = 0x14;
                        uVar4 = ref_cell_add(pRVar1->cell[3],local_38,&cell);
                        if (uVar4 == 0) {
                          local_38[0] = 0;
                          local_38[1] = 2;
                          local_38[2] = 3;
                          local_38[3] = 0x14;
                          uVar4 = ref_cell_add(pRVar1->cell[3],local_38,&cell);
                          if (uVar4 == 0) {
                            return 0;
                          }
                          pcVar6 = "add tri";
                          uVar5 = 0x15b;
                        }
                        else {
                          pcVar6 = "add tri";
                          uVar5 = 0x155;
                        }
                      }
                      else {
                        pcVar6 = "add tri";
                        uVar5 = 0x14f;
                      }
                    }
                    else {
                      pcVar6 = "add tri";
                      uVar5 = 0x149;
                    }
                  }
                  else {
                    pcVar6 = "add qua";
                    uVar5 = 0x143;
                  }
                }
                else {
                  pcVar6 = "add pyr";
                  uVar5 = 0x13c;
                }
              }
              else {
                pcVar6 = "init glob";
                uVar5 = 0x13a;
              }
            }
            else {
              pcVar6 = "add node";
              uVar5 = 0x135;
            }
          }
          else {
            pcVar6 = "add node";
            uVar5 = 0x130;
          }
        }
        else {
          pcVar6 = "add node";
          uVar5 = 299;
        }
      }
      else {
        pcVar6 = "add node";
        uVar5 = 0x126;
      }
    }
    else {
      pcVar6 = "add node";
      uVar5 = 0x121;
    }
  }
  else {
    pcVar6 = "create";
    uVar5 = 0x11d;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar5,
         "ref_fixture_pyr_grid",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pyr_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT nodes[5] = {0, 1, 2, 3, 4};
  REF_INT cell, node;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_initialize_n_global(ref_node, 5), "init glob");

  RSS(ref_cell_add(ref_grid_pyr(ref_grid), nodes, &cell), "add pyr");

  nodes[0] = 0;
  nodes[1] = 3;
  nodes[2] = 4;
  nodes[3] = 1;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add qua");

  nodes[0] = 0;
  nodes[1] = 1;
  nodes[2] = 2;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  nodes[0] = 1;
  nodes[1] = 4;
  nodes[2] = 2;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  nodes[0] = 4;
  nodes[1] = 3;
  nodes[2] = 2;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  nodes[0] = 0;
  nodes[1] = 2;
  nodes[2] = 3;
  nodes[3] = 20;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add tri");

  return REF_SUCCESS;
}